

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3CursorSeek(sqlite3_context *pContext,Fts3Cursor *pCsr)

{
  int iVar1;
  
  iVar1 = 0;
  if (pCsr->isRequireSeek != '\0') {
    iVar1 = fts3CursorSeekStmt(pCsr);
    if (iVar1 == 0) {
      sqlite3_bind_int64(pCsr->pStmt,1,pCsr->iPrevId);
      pCsr->isRequireSeek = '\0';
      iVar1 = sqlite3_step(pCsr->pStmt);
      if (iVar1 == 100) {
        return 0;
      }
      iVar1 = sqlite3_reset(pCsr->pStmt);
      if (iVar1 == 0) {
        if (*(long *)&(pCsr->base).pVtab[3].nRef != 0) {
          return 0;
        }
        pCsr->isEof = '\x01';
        iVar1 = 0x10b;
      }
    }
    if (pContext != (sqlite3_context *)0x0) {
      sqlite3_result_error_code(pContext,iVar1);
    }
  }
  return iVar1;
}

Assistant:

static int fts3CursorSeek(sqlite3_context *pContext, Fts3Cursor *pCsr){
  int rc = SQLITE_OK;
  if( pCsr->isRequireSeek ){
    rc = fts3CursorSeekStmt(pCsr);
    if( rc==SQLITE_OK ){
      sqlite3_bind_int64(pCsr->pStmt, 1, pCsr->iPrevId);
      pCsr->isRequireSeek = 0;
      if( SQLITE_ROW==sqlite3_step(pCsr->pStmt) ){
        return SQLITE_OK;
      }else{
        rc = sqlite3_reset(pCsr->pStmt);
        if( rc==SQLITE_OK && ((Fts3Table *)pCsr->base.pVtab)->zContentTbl==0 ){
          /* If no row was found and no error has occurred, then the %_content
          ** table is missing a row that is present in the full-text index.
          ** The data structures are corrupt.  */
          rc = FTS_CORRUPT_VTAB;
          pCsr->isEof = 1;
        }
      }
    }
  }

  if( rc!=SQLITE_OK && pContext ){
    sqlite3_result_error_code(pContext, rc);
  }
  return rc;
}